

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnFuncType
          (BinaryReaderInterp *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  ModuleDesc *this_00;
  Result RVar1;
  Enum EVar2;
  Location loc;
  void *local_b8;
  undefined8 uStack_b0;
  long local_a8;
  void *local_98;
  undefined8 uStack_90;
  long local_88;
  undefined1 local_78 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_68;
  pointer local_58;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_50;
  
  local_68.field_0.last_column = 0;
  local_78._0_8_ = (this->filename_)._M_len;
  local_78._8_8_ = (this->filename_)._M_str;
  local_68.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnFuncType
                    (&this->validator_,(Location *)local_78,param_count,param_types,result_count,
                     result_types,index);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    this_00 = this->module_;
    local_98 = (void *)0x0;
    uStack_90 = 0;
    local_88 = 0;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_98,param_types,
               param_types + param_count);
    local_a8 = 0;
    local_b8 = (void *)0x0;
    uStack_b0 = 0;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_b8,result_types,
               result_types + result_count);
    local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
    local_78._0_8_ = &PTR__FuncType_00244210;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_68.field_0,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_98);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_50,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_b8);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
    emplace_back<wabt::interp::FuncType>(&this_00->func_types,(FuncType *)local_78);
    local_78._0_8_ = &PTR__FuncType_00244210;
    if (local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68.field_1.offset != 0) {
      operator_delete((void *)local_68.field_1.offset,(long)local_58 - local_68._0_8_);
    }
    if (local_b8 != (void *)0x0) {
      operator_delete(local_b8,local_a8 - (long)local_b8);
    }
    if (local_98 != (void *)0x0) {
      operator_delete(local_98,local_88 - (long)local_98);
    }
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnFuncType(Index index,
                                      Index param_count,
                                      Type* param_types,
                                      Index result_count,
                                      Type* result_types) {
  CHECK_RESULT(validator_.OnFuncType(GetLocation(), param_count, param_types,
                                     result_count, result_types, index));
  module_.func_types.push_back(FuncType(ToInterp(param_count, param_types),
                                        ToInterp(result_count, result_types)));
  return Result::Ok;
}